

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_cs_derived.cpp
# Opt level: O0

bool lower_cs_derived(gl_linked_shader *shader)

{
  undefined1 local_90 [8];
  lower_cs_derived_visitor v;
  gl_linked_shader *shader_local;
  
  if (shader->Stage == MESA_SHADER_COMPUTE) {
    v.gl_LocalInvocationIndex = (ir_variable *)shader;
    anon_unknown.dwarf_43079::lower_cs_derived_visitor::lower_cs_derived_visitor
              ((lower_cs_derived_visitor *)local_90,shader);
    ir_hierarchical_visitor::run
              ((ir_hierarchical_visitor *)local_90,(exec_list *)(v.gl_LocalInvocationIndex)->type);
    shader_local._7_1_ = (bool)(v.super_ir_hierarchical_visitor.data_leave._1_1_ & 1);
  }
  else {
    shader_local._7_1_ = false;
  }
  return shader_local._7_1_;
}

Assistant:

bool
lower_cs_derived(gl_linked_shader *shader)
{
   if (shader->Stage != MESA_SHADER_COMPUTE)
      return false;

   lower_cs_derived_visitor v(shader);
   v.run(shader->ir);

   return v.progress;
}